

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AS_DCP_internal.h
# Opt level: O3

TrackSet<ASDCP::MXF::TimecodeComponent> *
ASDCP::MXF::CreateTimecodeTrack<ASDCP::MXF::MaterialPackage>
          (TrackSet<ASDCP::MXF::TimecodeComponent> *__return_storage_ptr__,OP1aHeader *Header,
          MaterialPackage *Package,Rational *tc_edit_rate,ui32_t tc_frame_rate,ui64_t TCStart,
          Dictionary *Dict)

{
  MDDEntry *pMVar1;
  TimecodeComponent *pTVar2;
  Dictionary *in_stack_ffffffffffffff78;
  undefined1 local_70 [16];
  _func_int *local_60 [2];
  undefined1 local_50 [8];
  undefined1 local_48;
  undefined4 local_47;
  undefined4 uStack_43;
  byte_t abStack_3f [4];
  byte_t abStack_3b [11];
  
  if (Dict != (Dictionary *)0x0) {
    pMVar1 = Dictionary::Type(Dict,MDD_TimecodeDataDef);
    local_48 = 1;
    local_47 = *(undefined4 *)pMVar1->ul;
    uStack_43 = *(undefined4 *)(pMVar1->ul + 4);
    abStack_3f = *(byte_t (*) [4])(pMVar1->ul + 8);
    abStack_3b._0_4_ = *(undefined4 *)(pMVar1->ul + 0xc);
    local_50 = (undefined1  [8])&PTR__IArchive_0021d318;
    local_70._0_8_ = local_60;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"Timecode Track","");
    CreateTrackAndSequence<ASDCP::MXF::MaterialPackage,ASDCP::MXF::TimecodeComponent>
              (__return_storage_ptr__,(MXF *)Header,(OP1aHeader *)Package,
               (MaterialPackage *)local_70,(string *)tc_edit_rate,(Rational *)local_50,(UL *)0x1,
               (ui32_t)Dict,in_stack_ffffffffffffff78);
    if ((_func_int **)local_70._0_8_ != local_60) {
      operator_delete((void *)local_70._0_8_,(ulong)(local_60[0] + 1));
    }
    pTVar2 = (TimecodeComponent *)operator_new(0xe8);
    TimecodeComponent::TimecodeComponent(pTVar2,Dict);
    __return_storage_ptr__->Clip = pTVar2;
    (*(Header->super_Partition).super_KLVFilePacket.super_KLVPacket._vptr_KLVPacket[0xd])
              (Header,pTVar2);
    std::vector<Kumu::UUID,_std::allocator<Kumu::UUID>_>::push_back
              (&(__return_storage_ptr__->Sequence->StructuralComponents).
                super_FixedSizeItemCollection<std::vector<Kumu::UUID,_std::allocator<Kumu::UUID>_>_>
                .super_vector<Kumu::UUID,_std::allocator<Kumu::UUID>_>,
               &(__return_storage_ptr__->Clip->super_StructuralComponent).super_InterchangeObject.
                InstanceUID);
    pTVar2 = __return_storage_ptr__->Clip;
    pTVar2->RoundedTimecodeBase = (ui16_t)tc_frame_rate;
    pTVar2->StartTimecode = TCStart;
    (pTVar2->super_StructuralComponent).DataDefinition.super_Identifier<16U>.m_HasValue =
         (bool)local_48;
    *(ulong *)(pTVar2->super_StructuralComponent).DataDefinition.super_Identifier<16U>.m_Value =
         CONCAT44(uStack_43,local_47);
    *(ulong *)((pTVar2->super_StructuralComponent).DataDefinition.super_Identifier<16U>.m_Value + 8)
         = CONCAT44(abStack_3b._0_4_,abStack_3f);
    return __return_storage_ptr__;
  }
  __assert_fail("Dict",
                "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/AS_DCP_internal.h"
                ,0x21c,
                "TrackSet<TimecodeComponent> ASDCP::MXF::CreateTimecodeTrack(OP1aHeader &, PackageT &, const MXF::Rational &, ui32_t, ui64_t, const Dictionary *) [PackageT = ASDCP::MXF::MaterialPackage]"
               );
}

Assistant:

TrackSet<TimecodeComponent>
	CreateTimecodeTrack(OP1aHeader& Header, PackageT& Package,
			    const MXF::Rational& tc_edit_rate, ui32_t tc_frame_rate, ui64_t TCStart, const Dictionary *Dict)
	{
	  assert(Dict);
	  UL TCUL(Dict->ul(MDD_TimecodeDataDef));

	  TrackSet<TimecodeComponent> NewTrack =
	    CreateTrackAndSequence<PackageT, TimecodeComponent>(Header, Package, "Timecode Track",
								tc_edit_rate, TCUL, 1, Dict);

	  NewTrack.Clip = new TimecodeComponent(Dict);
	  Header.AddChildObject(NewTrack.Clip);
	  NewTrack.Sequence->StructuralComponents.push_back(NewTrack.Clip->InstanceUID);
	  NewTrack.Clip->RoundedTimecodeBase = tc_frame_rate;
	  NewTrack.Clip->StartTimecode = TCStart;
	  NewTrack.Clip->DataDefinition = TCUL;

	  return NewTrack;
	}